

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_tools.cxx
# Opt level: O1

bool write_file(xr_file_system *fs,string *path,void *data,size_t size)

{
  xr_writer *pxVar1;
  
  pxVar1 = xray_re::xr_file_system::w_open(fs,(path->_M_dataplus)._M_p,false);
  if (pxVar1 != (xr_writer *)0x0) {
    (*pxVar1->_vptr_xr_writer[2])(pxVar1,data,size);
    (*pxVar1->_vptr_xr_writer[1])(pxVar1);
  }
  return pxVar1 != (xr_writer *)0x0;
}

Assistant:

static bool write_file(xr_file_system& fs, const std::string& path, const void* data, size_t size)
{
	xr_writer* w = fs.w_open(path);
	if (w) {
		w->w_raw(data, size);
		fs.w_close(w);
		return true;
	}
	return false;
}